

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int bitset_container_to_uint32_array(uint32_t *out,bitset_container_t *bc,uint32_t base)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  
  uVar1 = croaring_hardware_support();
  if (((uVar1 & 2) == 0) || ((long)bc->cardinality < 0x2000)) {
    if (((uVar1 & 1) == 0) || ((long)bc->cardinality < 0x2000)) {
      sVar3 = bitset_extract_setbits(bc->words,0x400,out,base);
      iVar2 = (int)sVar3;
    }
    else {
      sVar3 = bitset_extract_setbits_avx2(bc->words,0x400,out,(long)bc->cardinality,base);
      iVar2 = (int)sVar3;
    }
  }
  else {
    sVar3 = bitset_extract_setbits_avx512(bc->words,0x400,out,(long)bc->cardinality,base);
    iVar2 = (int)sVar3;
  }
  return iVar2;
}

Assistant:

int bitset_container_to_uint32_array(
    uint32_t *out,
    const bitset_container_t *bc,
    uint32_t base
){
#if CROARING_IS_X64
   int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
   if(( support & ROARING_SUPPORTS_AVX512 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx512(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
   else
#endif
   if(( support & ROARING_SUPPORTS_AVX2 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx2(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
	else
		return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#else
	return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#endif
}